

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaAllocation_T::DedicatedAllocMap(VmaAllocation_T *this,VmaAllocator hAllocator,void **ppData)

{
  bool bVar1;
  VmaVulkanFunctions *pVVar2;
  void **in_RDX;
  VmaAllocator_T *in_RSI;
  VmaAllocation_T *in_RDI;
  VkResult result;
  VkResult local_4;
  
  if ((in_RDI->m_MapCount != '\0') || (bVar1 = IsPersistentMap(in_RDI), bVar1)) {
    if (in_RDI->m_MapCount < 0xff) {
      *in_RDX = (in_RDI->field_0).m_DedicatedAllocation.m_pMappedData;
      in_RDI->m_MapCount = in_RDI->m_MapCount + '\x01';
      local_4 = VK_SUCCESS;
    }
    else {
      local_4 = VK_ERROR_MEMORY_MAP_FAILED;
    }
  }
  else {
    pVVar2 = VmaAllocator_T::GetVulkanFunctions(in_RSI);
    local_4 = (*pVVar2->vkMapMemory)
                        (in_RSI->m_hDevice,(in_RDI->field_0).m_DedicatedAllocation.m_hMemory,0,
                         0xffffffffffffffff,0,in_RDX);
    if (local_4 == VK_SUCCESS) {
      (in_RDI->field_0).m_DedicatedAllocation.m_pMappedData = *in_RDX;
      in_RDI->m_MapCount = '\x01';
    }
  }
  return local_4;
}

Assistant:

VkResult VmaAllocation_T::DedicatedAllocMap(VmaAllocator hAllocator, void** ppData)
{
    VMA_ASSERT(GetType() == ALLOCATION_TYPE_DEDICATED);
    VMA_ASSERT(IsMappingAllowed() && "Mapping is not allowed on this allocation! Please use one of the new VMA_ALLOCATION_CREATE_HOST_ACCESS_* flags when creating it.");

    if (m_MapCount != 0 || IsPersistentMap())
    {
        if (m_MapCount < 0xFF)
        {
            VMA_ASSERT(m_DedicatedAllocation.m_pMappedData != VMA_NULL);
            *ppData = m_DedicatedAllocation.m_pMappedData;
            ++m_MapCount;
            return VK_SUCCESS;
        }
        else
        {
            VMA_ASSERT(0 && "Dedicated allocation mapped too many times simultaneously.");
            return VK_ERROR_MEMORY_MAP_FAILED;
        }
    }
    else
    {
        VkResult result = (*hAllocator->GetVulkanFunctions().vkMapMemory)(
            hAllocator->m_hDevice,
            m_DedicatedAllocation.m_hMemory,
            0, // offset
            VK_WHOLE_SIZE,
            0, // flags
            ppData);
        if (result == VK_SUCCESS)
        {
            m_DedicatedAllocation.m_pMappedData = *ppData;
            m_MapCount = 1;
        }
        return result;
    }
}